

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timer.c
# Opt level: O3

void int_init(void)

{
  int iVar1;
  char *__nptr;
  int *piVar2;
  long lVar3;
  sigaction timer_action;
  itimerval timert;
  sigaction local_140;
  _union_1457 local_a8;
  sigset_t local_a0;
  undefined4 local_20;
  
  local_140.__sigaction_handler.sa_handler = int_timer_service;
  sigemptyset(&local_140.sa_mask);
  local_140.sa_flags = 0x10000000;
  iVar1 = sigaction(0x1a,&local_140,(sigaction *)0x0);
  if (iVar1 == -1) {
    perror("sigaction: SIGVTALRM");
  }
  local_a0.__val[1] = 0;
  local_a8.sa_handler = (__sighandler_t)0x0;
  local_a0.__val[0] = (ulong)TIMER_INTERVAL;
  local_a0.__val[2] = local_a0.__val[0];
  setitimer(ITIMER_VIRTUAL,(itimerval *)&local_a8,(itimerval *)0x0);
  local_140.__sigaction_handler.sa_handler = int_io_service;
  sigemptyset(&local_140.sa_mask);
  local_140.sa_flags = 0;
  iVar1 = sigaction(0x1d,&local_140,(sigaction *)0x0);
  if (iVar1 == -1) {
    perror("sigaction: SIGIO");
  }
  local_140.__sigaction_handler.sa_handler = timeout_error;
  sigemptyset(&local_140.sa_mask);
  local_140.sa_flags = 0;
  iVar1 = sigaction(0xe,&local_140,(sigaction *)0x0);
  if (iVar1 == -1) {
    perror("sigaction: SIGALRM");
  }
  __nptr = getenv("LDEFILETIMEOUT");
  if (__nptr != (char *)0x0) {
    piVar2 = __errno_location();
    *piVar2 = 0;
    lVar3 = strtol(__nptr,(char **)0x0,10);
    if (0 < (int)(uint)lVar3 && *piVar2 == 0) {
      TIMEOUT_TIME = (uint)lVar3;
    }
  }
  local_140.__sigaction_handler.sa_handler = panicuraid;
  sigemptyset(&local_140.sa_mask);
  local_140.sa_flags = 4;
  local_a8 = (_union_1457)0x1;
  sigemptyset(&local_a0);
  local_20 = 0;
  sigaction(1,&local_140,(sigaction *)0x0);
  sigaction(3,&local_140,(sigaction *)0x0);
  sigaction(4,&local_140,(sigaction *)0x0);
  sigaction(7,&local_140,(sigaction *)0x0);
  sigaction(0xb,&local_140,(sigaction *)0x0);
  sigaction(0x1f,&local_140,(sigaction *)0x0);
  sigaction(0xf,&local_140,(sigaction *)0x0);
  sigaction(0xd,(sigaction *)&local_a8,(sigaction *)0x0);
  int_unblock();
  return;
}

Assistant:

static void int_timer_init(void)

{
#ifdef DOS
  /******************************************************************************
  *  All code and data touched during the processing of an interrupt should
  *  locked prior to receiving any interrupts.  This prevents the Timer
  *  function from being swapped out during an interrupt.
  ******************************************************************************/
  _dpmi_lockregion((void *)Irq_Stk_End, sizeof(Irq_Stk_End));
  _dpmi_lockregion((void *)Irq_Stk_Check, sizeof(Irq_Stk_Check));
  _dpmi_lockregion((void *)tick_count, sizeof(tick_count));
  _dpmi_lockregion((void *)&DOStimer, 4096);
  _dpmi_lockregion((void *)prev_int_1c, sizeof(prev_int_1c));

  /* Set up the DOS time handler. */
  prev_int_1c = _dos_getvect(0x1c); /* get addr of current 1c hndlr, */
                                    /* if any*/
  _dos_setvect(0x1c, DOStimer);     /* hook our int handler to timer int */

#else
  struct itimerval timert;
  struct sigaction timer_action;

  timer_action.sa_handler = int_timer_service;
  sigemptyset(&timer_action.sa_mask);
  timer_action.sa_flags = SA_RESTART;

  if (sigaction(SIGVTALRM, &timer_action, NULL) == -1) {
    perror("sigaction: SIGVTALRM");
  }

  /* then attach a timer to it and turn it loose */
  timert.it_interval.tv_sec = timert.it_value.tv_sec = 0;
  timert.it_interval.tv_usec = timert.it_value.tv_usec = TIMER_INTERVAL;
  setitimer(ITIMER_VIRTUAL, &timert, NULL);

  DBPRINT(("Timer interval set to %ld usec\n", (long)timert.it_value.tv_usec));
#endif /* DOS */
}